

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lut.c
# Opt level: O3

_Bool chck_lut_set(chck_lut *lut,uint32_t lookup,void *data)

{
  ulong uVar1;
  ulong __n;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _Bool _Var4;
  uint32_t uVar5;
  size_t __size;
  uint8_t *__s;
  
  if ((lut == (chck_lut *)0x0) || (lut->hashuint == (_func_uint32_t_uint32_t *)0x0)) {
    __assert_fail("lut && lut->hashuint",
                  "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/lut/lut.c",
                  0x6d,"_Bool chck_lut_set(struct chck_lut *, uint32_t, const void *)");
  }
  uVar5 = (*lut->hashuint)(lookup);
  __s = lut->table;
  uVar1 = lut->count;
  __n = lut->member;
  if (__s == (uint8_t *)0x0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = __n;
    __size = SUB168(auVar2 * auVar3,0);
    if ((bool)(~(SUB168(auVar2 * auVar3,8) != 0) & __size != 0)) {
      __s = (uint8_t *)malloc(__size);
      lut->table = __s;
      if (__s != (uint8_t *)0x0) {
        memset(__s,lut->set,__size);
        goto LAB_001013a1;
      }
    }
    else {
      lut->table = (uint8_t *)0x0;
    }
    _Var4 = false;
  }
  else {
LAB_001013a1:
    if (data == (void *)0x0) {
      memset(__s + ((ulong)uVar5 % uVar1) * __n,lut->set,__n);
    }
    else {
      memcpy(__s + ((ulong)uVar5 % uVar1) * __n,data,__n);
    }
    _Var4 = true;
  }
  return _Var4;
}

Assistant:

bool
chck_lut_set(struct chck_lut *lut, uint32_t lookup, const void *data)
{
   assert(lut && lut->hashuint);
   return lut_set_index(lut, lut->hashuint(lookup) % lut->count, data);
}